

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int _kernel_w;
  int _kernel_h;
  int _c;
  Mat *bottom_blob;
  Mat *this_00;
  int *piVar1;
  int iVar2;
  Option *opt_00;
  Mat bias_data_flattened;
  Mat bottom_blob_bordered;
  Mat weight_data_flattened;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _kernel_w = bottom_blob[1].w;
  _kernel_h = bottom_blob[1].h;
  _c = bottom_blob[1].c;
  weight_data_flattened.cstep = 0;
  weight_data_flattened.data = (void *)0x0;
  weight_data_flattened.refcount._0_4_ = 0;
  weight_data_flattened.refcount._4_4_ = 0;
  weight_data_flattened.elemsize._0_4_ = 0;
  weight_data_flattened._20_8_ = 0;
  weight_data_flattened.allocator = (Allocator *)0x0;
  weight_data_flattened.dims = 0;
  weight_data_flattened.w = 0;
  weight_data_flattened.h = 0;
  weight_data_flattened.d = 0;
  weight_data_flattened.c = 0;
  flatten(bottom_blob + 1,&weight_data_flattened,opt);
  iVar2 = -100;
  if ((weight_data_flattened.data == (void *)0x0) ||
     ((long)weight_data_flattened.c * weight_data_flattened.cstep == 0)) goto LAB_00275144;
  bias_data_flattened.cstep = 0;
  bias_data_flattened.data = (void *)0x0;
  bias_data_flattened.refcount._0_4_ = 0;
  bias_data_flattened.refcount._4_4_ = 0;
  bias_data_flattened.elemsize._0_4_ = 0;
  bias_data_flattened._20_8_ = 0;
  bias_data_flattened.allocator = (Allocator *)0x0;
  bias_data_flattened.dims = 0;
  bias_data_flattened.w = 0;
  bias_data_flattened.h = 0;
  bias_data_flattened.d = 0;
  bias_data_flattened.c = 0;
  if (this->bias_term == 0) {
LAB_00274f85:
    bottom_blob_bordered.cstep = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered.elemsize._4_4_ = 0;
    bottom_blob_bordered.elempack = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.d = 0;
    bottom_blob_bordered.c = 0;
    make_padding(this,bottom_blob,&bottom_blob_bordered,_kernel_w,_kernel_h,opt);
    iVar2 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      opt_00 = (Option *)0x275044;
      Mat::create(this_00,(~((_kernel_w + -1) * this->dilation_w) + bottom_blob_bordered.w) /
                          this->stride_w + 1,
                  (~((_kernel_h + -1) * this->dilation_h) + bottom_blob_bordered.h) / this->stride_h
                  + 1,_c,CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                  (undefined4)bottom_blob_bordered.elemsize),opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        iVar2 = -100;
      }
      else {
        iVar2 = -100;
        if ((long)this_00->c * this_00->cstep != 0) {
          convolutiondepthwise
                    (&bottom_blob_bordered,this_00,&weight_data_flattened,&bias_data_flattened,
                     _kernel_w,_kernel_h,this->stride_w,this->stride_h,this->dilation_w,
                     this->dilation_h,this->group,this->activation_type,&this->activation_params,
                     opt_00);
          iVar2 = 0;
        }
      }
    }
    piVar1 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_
                            );
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
          if (bottom_blob_bordered.data != (void *)0x0) {
            free(bottom_blob_bordered.data);
          }
        }
        else {
          (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&bias_data_flattened,opt);
    iVar2 = -100;
    if ((bias_data_flattened.data != (void *)0x0) &&
       ((long)bias_data_flattened.c * bias_data_flattened.cstep != 0)) goto LAB_00274f85;
  }
  piVar1 = (int *)CONCAT44(bias_data_flattened.refcount._4_4_,bias_data_flattened.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (bias_data_flattened.allocator == (Allocator *)0x0) {
        if (bias_data_flattened.data != (void *)0x0) {
          free(bias_data_flattened.data);
        }
      }
      else {
        (*(bias_data_flattened.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00275144:
  piVar1 = (int *)CONCAT44(weight_data_flattened.refcount._4_4_,weight_data_flattened.refcount._0_4_
                          );
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (weight_data_flattened.allocator == (Allocator *)0x0) {
        if (weight_data_flattened.data != (void *)0x0) {
          free(weight_data_flattened.data);
        }
      }
      else {
        (*(weight_data_flattened.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int ConvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, _kernel_h, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}